

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O2

bool rcg::setString(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,char *value,
                   bool exception)

{
  element_type *peVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  undefined4 extraout_var;
  long *plVar8;
  long *plVar9;
  undefined8 uVar10;
  invalid_argument *piVar11;
  long lVar12;
  ulong uVar13;
  longlong lVar14;
  ulong uVar15;
  bool bVar16;
  float fVar17;
  string elem;
  allocator local_221;
  long *local_220;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  stringstream in;
  size_type local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)&in,name);
  iVar5 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,&in);
  plVar8 = (long *)CONCAT44(extraout_var,iVar5);
  GenICam_3_4::gcstring::~gcstring((gcstring *)&in);
  if (plVar8 == (long *)0x0) {
    if (!exception) {
      return false;
    }
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&elem,"Feature not found: ",(allocator *)&buffer);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,&elem,
                   name);
    std::invalid_argument::invalid_argument(piVar11,(string *)&in);
    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar5 = (*(code *)**(undefined8 **)((long)plVar8 + *(long *)(*plVar8 + -0x28)))
                    ((long)plVar8 + *(long *)(*plVar8 + -0x28));
  if ((iVar5 != 4) && (iVar5 != 2)) {
    if (!exception) {
      return false;
    }
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&elem,"Feature not writable: ",(allocator *)&buffer);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,&elem,
                   name);
    std::invalid_argument::invalid_argument(piVar11,(string *)&in);
    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  uVar6 = (**(code **)(*plVar8 + 0xf0))(plVar8);
  switch(uVar6) {
  case 2:
    plVar8 = (long *)__dynamic_cast(plVar8,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
    iVar5 = (**(code **)(*plVar8 + 0x88))(plVar8);
    if (iVar5 != 4) {
      if (iVar5 == 5) {
        std::__cxx11::string::string((string *)&elem,value,(allocator *)&buffer);
        local_220 = plVar8;
        std::__cxx11::stringstream::stringstream((stringstream *)&in,(string *)&elem,_S_out|_S_in);
        std::__cxx11::string::~string((string *)&elem);
        elem._M_dataplus._M_p = (pointer)&elem.field_2;
        elem._M_string_length = 0;
        elem.field_2._M_local_buf[0] = '\0';
        iVar5 = 4;
        uVar15 = 0;
        while (bVar4 = iVar5 != 0, iVar5 = iVar5 + -1, bVar4) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&in,(string *)&elem,'.');
          uVar7 = std::__cxx11::stoi(&elem,(size_t *)0x0,10);
          uVar15 = uVar15 << 8 | (ulong)(uVar7 & 0xff);
        }
        (**(code **)(*local_220 + 0x38))(local_220,uVar15,1);
      }
      else {
        if (iVar5 != 6) {
          std::__cxx11::string::string((string *)&in,value,(allocator *)&elem);
          lVar14 = std::__cxx11::stoll((string *)&in,(size_t *)0x0,10);
          (**(code **)(*plVar8 + 0x38))(plVar8,lVar14,1);
          break;
        }
        std::__cxx11::string::string((string *)&elem,value,(allocator *)&buffer);
        local_220 = plVar8;
        std::__cxx11::stringstream::stringstream((stringstream *)&in,(string *)&elem,_S_out|_S_in);
        std::__cxx11::string::~string((string *)&elem);
        elem._M_dataplus._M_p = (pointer)&elem.field_2;
        elem._M_string_length = 0;
        elem.field_2._M_local_buf[0] = '\0';
        iVar5 = 4;
        uVar15 = 0;
        while (bVar4 = iVar5 != 0, iVar5 = iVar5 + -1, bVar4) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&in,(string *)&elem,':');
          uVar7 = std::__cxx11::stoi(&elem,(size_t *)0x0,0x10);
          uVar15 = uVar15 << 8 | (ulong)(uVar7 & 0xff);
        }
        (**(code **)(*local_220 + 0x38))(local_220,uVar15,1);
      }
      std::__cxx11::string::~string((string *)&elem);
      std::__cxx11::stringstream::~stringstream((stringstream *)&in);
      return false;
    }
    std::__cxx11::string::string((string *)&in,value,(allocator *)&elem);
    lVar14 = std::__cxx11::stoll((string *)&in,(size_t *)0x0,0x10);
    (**(code **)(*plVar8 + 0x38))(plVar8,lVar14,1);
    break;
  case 3:
    plVar8 = (long *)__dynamic_cast(plVar8,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
    std::__cxx11::string::string((string *)&in,value,(allocator *)&elem);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in
                            ,"true");
    bVar16 = true;
    if (((!bVar4) &&
        (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&in,"True"), !bVar4)) &&
       (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&in,"TRUE"), !bVar4)) {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &in,"false");
      if (((bVar4) ||
          (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&in,"False"), bVar4)) ||
         (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&in,"FALSE"), bVar4)) {
        bVar16 = false;
      }
      else {
        iVar5 = std::__cxx11::stoi((string *)&in,(size_t *)0x0,10);
        bVar16 = iVar5 != 0;
      }
    }
    (**(code **)(*plVar8 + 0x38))(plVar8,bVar16,1);
    break;
  default:
    if (!exception) {
      return false;
    }
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&elem,"Feature of unknown datatype: ",(allocator *)&buffer);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,&elem,
                   name);
    std::invalid_argument::invalid_argument(piVar11,(string *)&in);
    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case 5:
    plVar8 = (long *)__dynamic_cast(plVar8,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IFloat::typeinfo,0xfffffffffffffffe);
    std::__cxx11::string::string((string *)&in,value,(allocator *)&elem);
    fVar17 = std::__cxx11::stof((string *)&in,(size_t *)0x0);
    (**(code **)(*plVar8 + 0x38))(SUB84((double)fVar17,0),plVar8,1);
    break;
  case 6:
    plVar8 = (long *)__dynamic_cast(plVar8,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IString::typeinfo,0xfffffffffffffffe);
    GenICam_3_4::gcstring::gcstring((gcstring *)&in,value);
    (**(code **)(*plVar8 + 0x38))(plVar8,&in,1);
    GenICam_3_4::gcstring::~gcstring((gcstring *)&in);
    return false;
  case 7:
    plVar8 = (long *)__dynamic_cast(plVar8,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
    std::__cxx11::string::string((string *)&in,value,(allocator *)&elem);
    local_220 = plVar8;
    lVar12 = std::__cxx11::string::find_first_not_of((char *)&in,0x124898);
    if (lVar12 != -1) {
      piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string((string *)&local_50,"Register \'",&local_221);
      std::operator+(&local_1f8,&local_50,name);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                     &local_1f8,"only accepts hedadecimal values: ");
      std::operator+(&elem,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &buffer,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in);
      std::invalid_argument::invalid_argument(piVar11,(string *)&elem);
      __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar15 = 0;
        puVar3 = buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish,
        puVar2 = buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start, plVar8 = local_220, uVar15 < local_1d0 - 1;
        uVar15 = uVar15 + 2) {
      std::__cxx11::string::substr((ulong)&elem,(ulong)&in);
      iVar5 = std::__cxx11::stoi(&elem,(size_t *)0x0,0x10);
      local_1f8._M_dataplus._M_p._0_1_ = (undefined1)iVar5;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (&buffer,(uchar *)&local_1f8);
      std::__cxx11::string::~string((string *)&elem);
    }
    uVar13 = (**(code **)(*local_220 + 0x48))(local_220,0);
    uVar15 = (long)puVar3 - (long)puVar2;
    if (uVar13 < uVar15) {
      uVar15 = uVar13;
    }
    (**(code **)(*plVar8 + 0x38))(plVar8,puVar2,uVar15,1);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    break;
  case 9:
    plVar8 = (long *)__dynamic_cast(plVar8,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
    GenICam_3_4::gcstring::gcstring((gcstring *)&in,value);
    plVar9 = (long *)(**(code **)(*plVar8 + 0x68))(plVar8,&in);
    GenICam_3_4::gcstring::~gcstring((gcstring *)&in);
    if (plVar9 != (long *)0x0) {
      uVar10 = (**(code **)(*plVar9 + 0x38))(plVar9);
      (**(code **)(*plVar8 + 0x50))(plVar8,uVar10,1);
      return false;
    }
    if (!exception) {
      return false;
    }
    piVar11 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_1f8,"Enumeration \'",(allocator *)&local_50);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&buffer,
                   &local_1f8,name);
    std::operator+(&elem,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &buffer,"\' does not contain: ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,&elem,
                   value);
    std::invalid_argument::invalid_argument(piVar11,(string *)&in);
    __cxa_throw(piVar11,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::~string((string *)&in);
  return false;
}

Assistant:

bool setString(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
               const char *value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        switch (node->GetPrincipalInterfaceType())
        {
          case GenApi::intfIBoolean:
            {
              GenApi::IBoolean *p=dynamic_cast<GenApi::IBoolean *>(node);

              std::string v=std::string(value);
              if (v == "true" || v == "True" || v == "TRUE")
              {
                p->SetValue(1);
              }
              else if (v == "false" || v == "False" || v == "FALSE")
              {
                p->SetValue(0);
              }
              else
              {
                p->SetValue(static_cast<bool>(std::stoi(v)));
              }
            }
            break;

          case GenApi::intfIInteger:
            {
              GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(node);

              switch (p->GetRepresentation())
              {
                case GenApi::HexNumber:
                  p->SetValue(std::stoll(std::string(value), 0, 16));
                  break;

                case GenApi::IPV4Address:
                  {
                    int64_t ip=0;

                    std::stringstream in(value);
                    std::string elem;

                    for (int i=0; i<4; i++)
                    {
                      getline(in, elem, '.');
                      ip=(ip<<8)|(stoi(elem)&0xff);
                    }

                    p->SetValue(ip);
                  }
                  break;

                case GenApi::MACAddress:
                  {
                    int64_t mac=0;

                    std::stringstream in(value);
                    std::string elem;

                    for (int i=0; i<4; i++)
                    {
                      getline(in, elem, ':');
                      mac=(mac<<8)|(stoi(elem, 0, 16)&0xff);
                    }

                    p->SetValue(mac);
                  }
                  break;

                default:
                  p->SetValue(std::stoll(std::string(value)));
                  break;
              }
            }
            break;

          case GenApi::intfIFloat:
            {
              GenApi::IFloat *p=dynamic_cast<GenApi::IFloat *>(node);
              p->SetValue(std::stof(std::string(value)));
            }
            break;

          case GenApi::intfIEnumeration:
            {
              GenApi::IEnumeration *p=dynamic_cast<GenApi::IEnumeration *>(node);
              GenApi::IEnumEntry *entry=0;

              try
              {
                entry=p->GetEntryByName(value);
              }
              catch (const GENICAM_NAMESPACE::GenericException &)
              { }

              if (entry != 0)
              {
                p->SetIntValue(entry->GetValue());
              }
              else if (exception)
              {
                throw std::invalid_argument(std::string("Enumeration '")+name+
                                            "' does not contain: "+value);
              }
            }
            break;

          case GenApi::intfIRegister:
            {
              GenApi::IRegister *p=dynamic_cast<GenApi::IRegister *>(node);

              std::string s=value;

              size_t n=s.find_first_not_of("0123456789abcdefABCDEF");
              if (n != std::string::npos)
              {
                throw std::invalid_argument(std::string("Register '")+name+
                  "only accepts hedadecimal values: "+s);
              }

              std::vector<uint8_t> buffer;
              for (size_t i=0; i<s.size()-1; i+=2)
              {
                buffer.push_back(stoi(s.substr(i, 2), 0, 16));
              }

              p->Set(buffer.data(), std::min(buffer.size(), static_cast<size_t>(p->GetLength())));
            }
            break;

          case GenApi::intfIString:
            {
              GenApi::IString *p=dynamic_cast<GenApi::IString *>(node);
              p->SetValue(value);
            }
            break;

          default:
            if (exception)
            {
              throw std::invalid_argument(std::string("Feature of unknown datatype: ")+name);
            }
            break;
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}